

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O2

void __thiscall tli_window_manager::TableBox::TableBox(TableBox *this,int rows,int cols)

{
  allocator_type local_42;
  allocator_type local_41;
  _Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
  local_40;
  value_type local_28;
  
  (this->super_Box).width_ = 0;
  (this->super_Box).height_ = 0;
  (this->super_Box)._vptr_Box = (_func_int **)&PTR_layout_00109b88;
  this->rows_ = rows;
  this->cols_ = cols;
  local_28.first = (Box *)0x0;
  local_28.second.first = 0;
  local_28.second.second = 0;
  std::
  vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
            *)&local_40,(long)cols,&local_28,&local_41);
  std::
  vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
  ::vector(&this->table_,(long)rows,(value_type *)&local_40,&local_42);
  std::
  _Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&local_40);
  return;
}

Assistant:

TableBox::TableBox(int rows, int cols) : rows_{rows}, cols_{cols}, table_(rows, std::vector<std::pair<Box *, Position>>(
        cols, std::make_pair(nullptr, std::make_pair(0, 0))
)) {}